

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

response * __thiscall
CppWebSpider::requests::post
          (response *__return_storage_ptr__,requests *this,string *host,string *uri,uint16_t port,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers,string json_data,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          data,CookieJar *cookie,int timeout)

{
  int sockfd;
  __hashtable *__h;
  int iVar1;
  string *psVar2;
  string *this_00;
  long *plVar3;
  bool bVar4;
  string local_268;
  string sendmsg;
  string post_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  this_00 = local_50;
  std::__cxx11::string::string(local_50,(string *)host);
  sockfd = init((requests *)this_00,(EVP_PKEY_CTX *)local_50);
  std::__cxx11::string::~string(local_50);
  if (sockfd < 0) {
    std::__cxx11::string::string((string *)&local_70,(string *)host);
    std::__cxx11::string::string((string *)&local_90,(string *)uri);
    std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&sendmsg);
    response::response(__return_storage_ptr__,&local_70,&local_90,&local_b0,
                       (CookieJar *)json_data.field_2._M_allocated_capacity);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    psVar2 = &local_70;
  }
  else {
    std::__cxx11::string::string((string *)&post_data,"",(allocator *)&sendmsg);
    if (*(long *)(json_data._M_dataplus._M_p + 8) == 0) {
      plVar3 = (long *)(json_data._M_string_length + 0x10);
      iVar1 = 0;
      while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
        bVar4 = iVar1 != 0;
        iVar1 = iVar1 + -1;
        if (bVar4) {
          std::__cxx11::string::append((char *)&post_data);
        }
        std::operator+(&local_1d0,&post_data,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar3 + 1));
        std::operator+(&local_268,&local_1d0,"=");
        std::operator+(&sendmsg,&local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar3 + 5));
        std::__cxx11::string::operator=((string *)&post_data,(string *)&sendmsg);
        std::__cxx11::string::~string((string *)&sendmsg);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&post_data);
    }
    std::__cxx11::to_string(&local_268,(int)post_data._M_string_length);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&sendmsg,(char (*) [15])"Content-Length",&local_268);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)headers,&sendmsg);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&sendmsg);
    std::__cxx11::string::~string((string *)&local_268);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[13],_const_char_(&)[34],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&sendmsg,(char (*) [13])"Content-Type",
               (char (*) [34])"application/x-www-form-urlencoded");
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)headers,&sendmsg);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&sendmsg);
    std::operator+(&local_f0,"POST ",uri);
    std::operator+(&local_d0,&local_f0," HTTP/1.1\r\n");
    std::operator+(&local_1d0,&local_d0,"Host: ");
    std::operator+(&local_268,&local_1d0,host);
    std::operator+(&sendmsg,&local_268,"\r\n");
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string((string *)&local_110,(string *)&sendmsg);
    std::__cxx11::string::string((string *)&local_130,(string *)host);
    psVar2 = uri;
    std::__cxx11::string::string((string *)&local_150,(string *)uri);
    make_header(&local_268,(requests *)psVar2,&local_110,&local_130,&local_150,headers,
                (CookieJar *)json_data.field_2._M_allocated_capacity);
    std::__cxx11::string::operator=((string *)&sendmsg,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::append((string *)&sendmsg);
    std::__cxx11::string::string((string *)&local_170,(string *)host);
    std::__cxx11::string::string((string *)&local_190,(string *)uri);
    psVar2 = &sendmsg;
    std::__cxx11::string::string((string *)&local_1b0,(string *)psVar2);
    request_and_recv(__return_storage_ptr__,(requests *)psVar2,&local_170,&local_190,sockfd,
                     &local_1b0,(CookieJar *)json_data.field_2._M_allocated_capacity,
                     json_data.field_2._8_4_);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_170);
    close(sockfd);
    std::__cxx11::string::~string((string *)&sendmsg);
    psVar2 = &post_data;
  }
  std::__cxx11::string::~string((string *)psVar2);
  return __return_storage_ptr__;
}

Assistant:

response requests::post(std::string host,std::string uri,uint16_t port,
				std::unordered_map<std::string,std::string> headers,
				std::string json_data,
				std::unordered_map<std::string,std::string> data,
				CookieJar *cookie,
				int timeout){
		int sockfd;
		if((sockfd=init(host,port))<0)
			return response(host,uri,"",cookie);;

		std::string post_data="";
		if(json_data.size()!=0)
			post_data=json_data;
		else{
			int data_count=0;
			for(auto data_iter=data.begin();data_iter!=data.end();++data_iter){
				if(data_count>0)
					post_data+="&";
				post_data=post_data+data_iter->first+"="+data_iter->second;
				data_count++;
			}
		}

		int data_size=post_data.size();
		headers.insert({"Content-Length",std::to_string(data_size)});
		headers.insert({"Content-Type","application/x-www-form-urlencoded"});

		//base header
		std::string sendmsg=
				"POST "+uri+" HTTP/1.1\r\n"+
				"Host: "+ host+"\r\n";

		sendmsg=make_header(sendmsg,host,uri,headers,cookie);
		sendmsg+=post_data;

		response res=this->request_and_recv(host,uri,sockfd,sendmsg,cookie,timeout);
		close(sockfd);

		return res;
	}